

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void lj_record_tailcall(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  BCReg cbase;
  ptrdiff_t nargs_local;
  BCReg func_local;
  jit_State *J_local;
  
  rec_call_setup(J,func,nargs);
  nargs_local._4_4_ = func;
  if ((J->L->base[-1].u64 & 7) == 3) {
    uVar3 = J->L->base[-1].it64 >> 3;
    iVar2 = (int)uVar3;
    iVar1 = J->framedepth + -1;
    J->framedepth = iVar1;
    if (iVar1 < 0) {
      lj_trace_err(J,LJ_TRERR_NYIRETL);
    }
    J->baseslot = J->baseslot - iVar2;
    J->base = J->base + -(uVar3 & 0xffffffff);
    nargs_local._4_4_ = iVar2 + func;
  }
  if (J->baseslot == 2) {
    J->base[nargs_local._4_4_ + 1] = 0x10000;
  }
  memmove(J->base + -2,J->base + nargs_local._4_4_,(ulong)(J->maxslot + 2) << 2);
  iVar2 = J->tailcalled + 1;
  J->tailcalled = iVar2;
  if (J->loopunroll < iVar2) {
    lj_trace_err(J,LJ_TRERR_LUNROLL);
  }
  return;
}

Assistant:

void lj_record_tailcall(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  rec_call_setup(J, func, nargs);
  if (frame_isvarg(J->L->base - 1)) {
    BCReg cbase = (BCReg)frame_delta(J->L->base - 1);
    if (--J->framedepth < 0)
      lj_trace_err(J, LJ_TRERR_NYIRETL);
    J->baseslot -= (BCReg)cbase;
    J->base -= cbase;
    func += cbase;
  }
  /* Move func + args down. */
  if (LJ_FR2 && J->baseslot == 2)
    J->base[func+1] = TREF_FRAME;
  memmove(&J->base[-1-LJ_FR2], &J->base[func], sizeof(TRef)*(J->maxslot+1+LJ_FR2));
  /* Note: the new TREF_FRAME is now at J->base[-1] (even for slot #0). */
  /* Tailcalls can form a loop, so count towards the loop unroll limit. */
  if (++J->tailcalled > J->loopunroll)
    lj_trace_err(J, LJ_TRERR_LUNROLL);
}